

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O0

void __thiscall
absl::lts_20240722::Cord::PrependArray(Cord *this,string_view src,MethodIdentifier method)

{
  undefined8 uVar1;
  bool bVar2;
  CordRep *pCVar3;
  size_type sVar4;
  char *pcVar5;
  const_pointer pvVar6;
  Nullable<const_char_*> __src;
  Nullable<CordRep_*> tree;
  CordRep *rep;
  InlineData data;
  size_t cur_size;
  MethodIdentifier method_local;
  Cord *this_local;
  string_view src_local;
  
  src_local._M_len = (size_t)src._M_str;
  this_local = (Cord *)src._M_len;
  InlineRep::MaybeRemoveEmptyCrcNode(&this->contents_);
  bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  if (!bVar2) {
    bVar2 = InlineRep::is_tree(&this->contents_);
    if (!bVar2) {
      pCVar3 = (CordRep *)InlineRep::inline_size(&this->contents_);
      data.rep_.field_0.as_tree.rep = pCVar3;
      sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      if (pCVar3->storage + (sVar4 - 0xd) < (uint8_t *)0x10) {
        cord_internal::InlineData::InlineData((InlineData *)&rep);
        uVar1 = data.rep_.field_0.as_tree.rep;
        sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                          ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
        cord_internal::InlineData::set_inline_size
                  ((InlineData *)&rep,(size_t)(((CordRep *)uVar1)->storage + (sVar4 - 0xd)));
        pcVar5 = cord_internal::InlineData::as_chars((InlineData *)&rep);
        pvVar6 = std::basic_string_view<char,_std::char_traits<char>_>::data
                           ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
        sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                          ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
        memcpy(pcVar5,pvVar6,sVar4);
        pcVar5 = cord_internal::InlineData::as_chars((InlineData *)&rep);
        sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                          ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
        __src = InlineRep::data(&this->contents_);
        memcpy(pcVar5 + sVar4,__src,(size_t)data.rep_.field_0.as_tree.rep);
        cord_internal::InlineData::operator=((InlineData *)this,(InlineData *)&rep);
        return;
      }
    }
    pvVar6 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    tree = NewTree(pvVar6,sVar4,0);
    InlineRep::PrependTree(&this->contents_,tree,method);
  }
  return;
}

Assistant:

void Cord::PrependArray(absl::string_view src, MethodIdentifier method) {
  contents_.MaybeRemoveEmptyCrcNode();
  if (src.empty()) return;  // memcpy(_, nullptr, 0) is undefined.

  if (!contents_.is_tree()) {
    size_t cur_size = contents_.inline_size();
    if (cur_size + src.size() <= InlineRep::kMaxInline) {
      // Use embedded storage.
      InlineData data;
      data.set_inline_size(cur_size + src.size());
      memcpy(data.as_chars(), src.data(), src.size());
      memcpy(data.as_chars() + src.size(), contents_.data(), cur_size);
      contents_.data_ = data;
      return;
    }
  }
  CordRep* rep = NewTree(src.data(), src.size(), 0);
  contents_.PrependTree(rep, method);
}